

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialized_message.h
# Opt level: O0

void __thiscall
miniros::SerializedMessage::SerializedMessage
          (SerializedMessage *this,shared_array_uint8_t *buf,size_t num_bytes)

{
  shared_ptr<unsigned_char[]> *psVar1;
  bool bVar2;
  element_type *in_RDX;
  __shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  shared_ptr<unsigned_char[]> *in_RDI;
  shared_ptr<unsigned_char[]> *in_stack_ffffffffffffffc8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  std::shared_ptr<unsigned_char[]>::shared_ptr(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI[1].super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDX;
  psVar1 = in_RDI + 1;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RSI);
  if (bVar2) {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get(in_RSI);
  }
  else {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  (psVar1->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       p_Var3;
  std::shared_ptr<const_void>::shared_ptr((shared_ptr<const_void> *)0x4ab8f0);
  in_RDI[3].super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

SerializedMessage(shared_array_uint8_t buf, size_t num_bytes)
  : buf(buf)
  , num_bytes(num_bytes)
  , message_start(buf ? buf.get() : 0)
  , type_info(0)
  { }